

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddInteract.c
# Opt level: O3

int cuddInitInteract(DdManager *table)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  DdNode **ppDVar3;
  DdSubtable *pDVar4;
  long *__s;
  int *support;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  DdNode *sentinel;
  long lVar10;
  ulong uVar11;
  int *piVar12;
  int iVar13;
  ulong uVar14;
  DdManager *pDVar15;
  ulong uVar16;
  DdManager *pDVar17;
  uint uVar18;
  
  uVar1 = table->size;
  uVar9 = (ulong)uVar1;
  uVar18 = ((int)((uVar1 - 1) * uVar1) >> 7) + 1;
  __size = (ulong)uVar18 * 8;
  __s = (long *)malloc(__size);
  table->interact = __s;
  if (__s == (long *)0x0) {
    table->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    if (uVar18 != 0) {
      memset(__s,0,__size);
    }
    support = (int *)malloc((long)(int)uVar1 << 2);
    if (support != (int *)0x0) {
      if (0 < (int)uVar1) {
        uVar8 = 0;
        uVar5 = uVar9;
        do {
          lVar10 = (long)(int)table->subtables[uVar8].slots;
          if (0 < lVar10) {
            ppDVar3 = table->subtables[uVar8].nodelist;
            lVar7 = 0;
            do {
              for (pDVar17 = (DdManager *)ppDVar3[lVar7]; pDVar17 != table;
                  pDVar17 = (DdManager *)((ulong)(pDVar17->sentinel).next & 0xfffffffffffffffe)) {
                if (((ulong)(pDVar17->sentinel).next & 1) == 0) {
                  memset(support,0,uVar9 * 4);
                  ddSuppInteract(&pDVar17->sentinel,support);
                  ddClearLocal(&pDVar17->sentinel);
                  iVar2 = table->size;
                  uVar5 = (ulong)iVar2;
                  if (1 < (long)uVar5) {
                    uVar14 = 0;
                    uVar11 = uVar5;
                    piVar12 = support;
                    do {
                      piVar12 = piVar12 + 1;
                      uVar11 = uVar11 - 1;
                      if (support[uVar14] == 1) {
                        iVar13 = (int)uVar14;
                        uVar16 = 0;
                        do {
                          if (piVar12[uVar16] == 1) {
                            iVar6 = (((iVar2 * 2 + -3) - iVar13) * iVar13 >> 1) + iVar13 +
                                    (int)uVar16;
                            table->interact[iVar6 >> 6] =
                                 table->interact[iVar6 >> 6] | 1L << ((byte)iVar6 & 0x3f);
                          }
                          uVar16 = uVar16 + 1;
                        } while (uVar11 != uVar16);
                      }
                      uVar14 = uVar14 + 1;
                    } while (uVar14 != iVar2 - 1);
                  }
                }
              }
              lVar7 = lVar7 + 1;
            } while (lVar7 != lVar10);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar9);
        if (0 < (int)uVar5) {
          pDVar4 = table->subtables;
          uVar9 = 0;
          do {
            lVar10 = (long)(int)pDVar4[uVar9].slots;
            if (0 < lVar10) {
              ppDVar3 = pDVar4[uVar9].nodelist;
              lVar7 = 0;
              do {
                pDVar17 = (DdManager *)ppDVar3[lVar7];
                while (pDVar17 != table) {
                  pDVar15 = (DdManager *)((ulong)(pDVar17->sentinel).next & 0xfffffffffffffffe);
                  (pDVar17->sentinel).next = (DdNode *)pDVar15;
                  pDVar17 = pDVar15;
                }
                lVar7 = lVar7 + 1;
              } while (lVar7 != lVar10);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != (uVar5 & 0xffffffff));
        }
      }
      free(support);
      return 1;
    }
    table->errorCode = CUDD_MEMORY_OUT;
    free(__s);
  }
  return 0;
}

Assistant:

int
cuddInitInteract(
  DdManager * table)
{
    int i,j,k;
    ABC_UINT64_T words;
    long *interact;
    int *support;
    DdNode *f;
    DdNode *sentinel = &(table->sentinel);
    DdNodePtr *nodelist;
    int slots;
    int n = table->size;

    words = ((n * (n-1)) >> (1 + LOGBPL)) + 1;
    table->interact = interact = ABC_ALLOC(long,(unsigned)words);
    if (interact == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        return(0);
    }
    for (i = 0; i < words; i++) {
        interact[i] = 0;
    }

    support = ABC_ALLOC(int,n);
    if (support == NULL) {
        table->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(interact);
        return(0);
    }

    for (i = 0; i < n; i++) {
        nodelist = table->subtables[i].nodelist;
        slots = table->subtables[i].slots;
        for (j = 0; j < slots; j++) {
            f = nodelist[j];
            while (f != sentinel) {
                /* A node is a root of the DAG if it cannot be
                ** reached by nodes above it. If a node was never
                ** reached during the previous depth-first searches,
                ** then it is a root, and we start a new depth-first
                ** search from it.
                */
                if (!Cudd_IsComplement(f->next)) {
                    for (k = 0; k < n; k++) {
                        support[k] = 0;
                    }
                    ddSuppInteract(f,support);
                    ddClearLocal(f);
                    ddUpdateInteract(table,support);
                }
                f = Cudd_Regular(f->next);
            }
        }
    }
    ddClearGlobal(table);

    ABC_FREE(support);
    return(1);

}